

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duhtag.c
# Opt level: O0

char * duh_get_tag(DUH *duh,char *key)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 8) != 0)) {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
      iVar1 = strcmp(in_RSI,*(char **)(*(long *)(in_RDI + 8) + (long)local_1c * 0x10));
      if (iVar1 == 0) {
        return *(char **)(*(long *)(in_RDI + 8) + (long)local_1c * 0x10 + 8);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *DUMBEXPORT duh_get_tag(DUH *duh, const char *key)
{
	int i;
	ASSERT(key);
	if (!duh || !duh->tag) return NULL;

	for (i = 0; i < duh->n_tags; i++)
		if (strcmp(key, duh->tag[i][0]) == 0)
			return duh->tag[i][1];

	return NULL;
}